

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O3

int bcf_hdr_parse_sample_line(bcf_hdr_t *h,char *str)

{
  byte bVar1;
  int iVar2;
  char *__dest;
  int iVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  
  pcVar6 = str + 1;
  iVar3 = 0;
  iVar4 = 0;
  pcVar5 = str;
  do {
    bVar1 = pcVar6[-1];
    if ((bVar1 < 0xb) && ((0x601U >> (bVar1 & 0x1f) & 1) != 0)) {
      if (8 < iVar3) {
        __dest = (char *)malloc(((long)pcVar5 - (long)str) + 1);
        strncpy(__dest,str,(long)pcVar5 - (long)str);
        pcVar5[(long)__dest - (long)str] = '\0';
        iVar2 = bcf_hdr_add_sample(h,__dest);
        if (iVar2 < 0) {
          iVar4 = -1;
        }
        free(__dest);
        bVar1 = pcVar6[-1];
      }
      if ((bVar1 == 0) || (bVar1 == 10)) {
        return iVar4;
      }
      iVar3 = iVar3 + 1;
      str = pcVar6;
    }
    pcVar6 = pcVar6 + 1;
    pcVar5 = pcVar5 + 1;
  } while( true );
}

Assistant:

int bcf_hdr_parse_sample_line(bcf_hdr_t *h, const char *str)
{
    int ret = 0;
    int i = 0;
    const char *p, *q;
    // add samples
    for (p = q = str;; ++q) {
        if (*q != '\t' && *q != 0 && *q != '\n') continue;
        if (++i > 9) {
            char *s = (char*)malloc(q - p + 1);
            strncpy(s, p, q - p);
            s[q - p] = 0;
            if ( bcf_hdr_add_sample(h,s) < 0 ) ret = -1;
            free(s);
        }
        if (*q == 0 || *q == '\n') break;
        p = q + 1;
    }
    bcf_hdr_add_sample(h,NULL);
    return ret;
}